

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int demo(void)

{
  pointer *result;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  void *pvVar4;
  char *result_00;
  reference piVar5;
  reference pfVar6;
  MyParser *this;
  int my_struct_a;
  UserStructInterface *my_struct;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_f0;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_e8;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_e0;
  const_iterator iter_1;
  vector<float,_std::allocator<float>_> float_vec;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_b8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_b0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  const_iterator iter;
  vector<int,_std::allocator<int>_> int_vec;
  string str_a;
  char *a;
  int local_58;
  float f_num;
  int num;
  allocator local_41;
  undefined1 local_40 [8];
  string line_1;
  Parse test;
  
  parse::Parse::Parse((Parse *)((long)&line_1.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_40,"xxxxx\t22\t3.3\tss\tsss\t3:2222,3333,44444\t3:2.0,3.0,4.0\t33",
             &local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  parse::Parse::parse_line((Parse *)((long)&line_1.field_2 + 8),(string *)local_40);
  local_58 = 0;
  parse::Parse::get_column<int>((Parse *)((long)&line_1.field_2 + 8),1,&local_58);
  poVar3 = std::operator<<((ostream *)&std::cout,"int format: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,local_58);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  a._4_4_ = 0.0;
  parse::Parse::get_column<float>((Parse *)((long)&line_1.field_2 + 8),2,(float *)((long)&a + 4));
  poVar3 = std::operator<<((ostream *)&std::cout,"float format: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,a._4_4_);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  result_00 = (char *)operator_new__(3);
  parse::Parse::get_column<char>((Parse *)((long)&line_1.field_2 + 8),3,result_00);
  poVar3 = std::operator<<((ostream *)&std::cout,"char* format: ");
  poVar3 = std::operator<<(poVar3,result_00);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  result = &int_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage;
  std::__cxx11::string::string((string *)result);
  parse::Parse::get_column<std::__cxx11::string>
            ((Parse *)((long)&line_1.field_2 + 8),3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)result);
  poVar3 = std::operator<<((ostream *)&std::cout,"string format: ");
  poVar3 = std::operator<<(poVar3,(string *)
                                  &int_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&iter);
  parse::Parse::get_column<std::vector<int,std::allocator<int>>>
            ((Parse *)((long)&line_1.field_2 + 8),5,(vector<int,_std::allocator<int>_> *)&iter);
  poVar3 = std::operator<<((ostream *)&std::cout,"int array format: ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_b0._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)&iter);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_a8,
             &local_b0);
  while( true ) {
    local_b8._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)&iter);
    bVar1 = __gnu_cxx::operator!=(&local_a8,&local_b8);
    if (!bVar1) break;
    piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_a8);
    pvVar4 = (void *)std::ostream::operator<<(&std::cout,*piVar5);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_a8,0);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&iter_1);
  parse::Parse::get_column<std::vector<float,std::allocator<float>>>
            ((Parse *)((long)&line_1.field_2 + 8),5,(vector<float,_std::allocator<float>_> *)&iter_1
            );
  poVar3 = std::operator<<((ostream *)&std::cout,"float array format: ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_e8._M_current =
       (float *)std::vector<float,_std::allocator<float>_>::begin
                          ((vector<float,_std::allocator<float>_> *)&iter_1);
  __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
  __normal_iterator<float*>
            ((__normal_iterator<float_const*,std::vector<float,std::allocator<float>>> *)&local_e0,
             &local_e8);
  while( true ) {
    local_f0._M_current =
         (float *)std::vector<float,_std::allocator<float>_>::end
                            ((vector<float,_std::allocator<float>_> *)&iter_1);
    bVar1 = __gnu_cxx::operator!=(&local_e0,&local_f0);
    if (!bVar1) break;
    pfVar6 = __gnu_cxx::
             __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&local_e0);
    pvVar4 = (void *)std::ostream::operator<<(&std::cout,*pfVar6);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
    operator++(&local_e0,0);
  }
  this = (MyParser *)operator_new(0x10);
  parse::MyParser::MyParser(this);
  parse::Parse::get_column<parse::UserStructInterface>
            ((Parse *)((long)&line_1.field_2 + 8),7,(UserStructInterface *)this);
  iVar2 = parse::MyParser::get_data(this);
  pvVar4 = (void *)std::ostream::operator<<(&std::cout,iVar2);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&iter_1);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&iter);
  std::__cxx11::string::~string
            ((string *)
             &int_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::__cxx11::string::~string((string *)local_40);
  parse::Parse::~Parse((Parse *)((long)&line_1.field_2 + 8));
  return 0;
}

Assistant:

int demo(){
    parse::Parse test = parse::Parse();
    std::string line_1 = "xxxxx\t22\t3.3\tss\tsss\t3:2222,3333,44444\t3:2.0,3.0,4.0\t33";
    test.parse_line(line_1);

    int num = 0;
    test.get_column(1, &num);
    std::cout << "int format: " << num << std::endl;

    float f_num = 0.0;
    test.get_column(2, &f_num);
    std::cout << "float format: "  << f_num << std::endl;

    char *a = new char[3];
    test.get_column(3, a);
    std::cout << "char* format: " << a << std::endl;

    std::string str_a;
    test.get_column(3, &str_a);
    std::cout << "string format: " << str_a << std::endl;

    std::vector<int> int_vec;
    test.get_column(5, &int_vec);
    std::cout << "int array format: " << std::endl;
    for (std::vector<int>::const_iterator iter = int_vec.begin();
        iter != int_vec.end(); iter++){
        std::cout << *iter << std::endl;
    }

    std::vector<float> float_vec;
    test.get_column(5, &float_vec);
    std::cout << "float array format: " << std::endl;
    for (std::vector<float>::const_iterator iter = float_vec.begin();
        iter != float_vec.end(); iter++){
        std::cout << *iter << std::endl;
    }

    parse::UserStructInterface *my_struct = new parse::MyParser();
    test.get_column(7, my_struct);
    int my_struct_a = ((parse::MyParser*)my_struct)->get_data();
    std::cout << my_struct_a << std::endl;

    return 0;
}